

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_input_success(mpc_input_t *i,char c,char **o)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char **o_local;
  char c_local;
  mpc_input_t *i_local;
  
  if ((i->type == 2) && (i->buffer != (char *)0x0)) {
    iVar1 = mpc_input_buffer_in_range(i);
    if (iVar1 == 0) {
      pcVar3 = i->buffer;
      sVar2 = strlen(i->buffer);
      pcVar3 = (char *)realloc(pcVar3,sVar2 + 2);
      i->buffer = pcVar3;
      pcVar3 = i->buffer;
      sVar2 = strlen(i->buffer);
      pcVar3[sVar2 + 1] = '\0';
      pcVar3 = i->buffer;
      sVar2 = strlen(i->buffer);
      pcVar3[sVar2] = c;
    }
  }
  i->last = c;
  (i->state).pos = (i->state).pos + 1;
  (i->state).col = (i->state).col + 1;
  if (c == '\n') {
    (i->state).col = 0;
    (i->state).row = (i->state).row + 1;
  }
  if (o != (char **)0x0) {
    pcVar3 = (char *)mpc_malloc(i,2);
    *o = pcVar3;
    **o = c;
    (*o)[1] = '\0';
  }
  return 1;
}

Assistant:

static int mpc_input_success(mpc_input_t *i, char c, char **o) {

  if (i->type == MPC_INPUT_PIPE
  &&  i->buffer && !mpc_input_buffer_in_range(i)) {
    i->buffer = realloc(i->buffer, strlen(i->buffer) + 2);
    i->buffer[strlen(i->buffer) + 1] = '\0';
    i->buffer[strlen(i->buffer) + 0] = c;
  }

  i->last = c;
  i->state.pos++;
  i->state.col++;

  if (c == '\n') {
    i->state.col = 0;
    i->state.row++;
  }

  if (o) {
    (*o) = mpc_malloc(i, 2);
    (*o)[0] = c;
    (*o)[1] = '\0';
  }

  return 1;
}